

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus
ZydisDecodeMVEX(ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,ZyanU8 *data)

{
  byte bVar1;
  ZyanStatus ZVar2;
  
  if (*data != 'b') {
    __assert_fail("data[0] == 0x62",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x275,
                  "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                 );
  }
  if (instruction->length - 4 == (uint)(instruction->raw).field_3.evex.V2) {
    ZVar2 = 0x80200001;
    if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
      *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x40;
      (instruction->raw).field_3.rex.W = data[1] >> 7;
      (instruction->raw).field_3.rex.R = data[1] >> 6 & 1;
      (instruction->raw).field_3.rex.X = data[1] >> 5 & 1;
      (instruction->raw).field_3.rex.B = data[1] >> 4 & 1;
      bVar1 = data[1];
      (instruction->raw).field_3.rex.offset = bVar1 & 0xf;
      ZVar2 = 0x80200007;
      if ((bVar1 & 0xf) < 4) {
        bVar1 = data[2];
        (instruction->raw).field_3.xop.vvvv = bVar1 >> 7;
        (instruction->raw).field_3.xop.L = data[2] >> 3 & 0xf;
        if ((data[2] & 4) != 0) {
          __assert_fail("((data[2] >> 2) & 0x01) == 0x00",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x28e,
                        "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                       );
        }
        (instruction->raw).field_3.xop.pp = data[2] & 3;
        (instruction->raw).field_3.xop.offset = data[3] >> 7;
        (instruction->raw).field_3.vex.size = data[3] >> 4 & 7;
        (instruction->raw).field_3.evex.L = data[3] >> 3 & 1;
        (instruction->raw).field_3.evex.b = data[3] & 7;
        (context->vector_unified).W = bVar1 >> 7;
        (context->vector_unified).R = ~(instruction->raw).field_3.rex.W & 1;
        (context->vector_unified).X = ~(instruction->raw).field_3.rex.R & 1;
        (context->vector_unified).B = ~(instruction->raw).field_3.rex.X & 1;
        (context->vector_unified).R2 = ~(instruction->raw).field_3.rex.B & 1;
        (context->vector_unified).V2 = ~(instruction->raw).field_3.evex.L & 1;
        (context->vector_unified).LL = '\x02';
        (context->vector_unified).vvvv = ~(instruction->raw).field_3.xop.L & 0xf;
        (context->vector_unified).mask = (instruction->raw).field_3.evex.b;
        ZVar2 = 0x100000;
      }
    }
    return ZVar2;
  }
  __assert_fail("instruction->raw.mvex.offset == instruction->length - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0x276,
                "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
               );
}

Assistant:

static ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext* context,
    ZydisDecodedInstruction* instruction, const ZyanU8 data[4])
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(data[0] == 0x62);
    ZYAN_ASSERT(instruction->raw.mvex.offset == instruction->length - 4);

    if (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)
    {
        // MVEX is only valid in 64-bit mode
        return ZYDIS_STATUS_DECODING_ERROR;
    }

    instruction->attributes |= ZYDIS_ATTRIB_HAS_MVEX;
    instruction->raw.mvex.R    = (data[1] >> 7) & 0x01;
    instruction->raw.mvex.X    = (data[1] >> 6) & 0x01;
    instruction->raw.mvex.B    = (data[1] >> 5) & 0x01;
    instruction->raw.mvex.R2   = (data[1] >> 4) & 0x01;
    instruction->raw.mvex.mmmm = (data[1] >> 0) & 0x0F;

    if (instruction->raw.mvex.mmmm > 0x03)
    {
        // Invalid according to the intel documentation
        return ZYDIS_STATUS_INVALID_MAP;
    }

    instruction->raw.mvex.W    = (data[2] >> 7) & 0x01;
    instruction->raw.mvex.vvvv = (data[2] >> 3) & 0x0F;

    ZYAN_ASSERT(((data[2] >> 2) & 0x01) == 0x00);

    instruction->raw.mvex.pp   = (data[2] >> 0) & 0x03;
    instruction->raw.mvex.E    = (data[3] >> 7) & 0x01;
    instruction->raw.mvex.SSS  = (data[3] >> 4) & 0x07;
    instruction->raw.mvex.V2   = (data[3] >> 3) & 0x01;
    instruction->raw.mvex.kkk  = (data[3] >> 0) & 0x07;

    // Update internal fields
    context->vector_unified.W    = instruction->raw.mvex.W;
    context->vector_unified.R    = 0x01 & ~instruction->raw.mvex.R;
    context->vector_unified.X    = 0x01 & ~instruction->raw.mvex.X;
    context->vector_unified.B    = 0x01 & ~instruction->raw.mvex.B;
    context->vector_unified.R2   = 0x01 & ~instruction->raw.mvex.R2;
    context->vector_unified.V2   = 0x01 & ~instruction->raw.mvex.V2;
    context->vector_unified.LL   = 2;
    context->vector_unified.vvvv = 0x0F & ~instruction->raw.mvex.vvvv;
    context->vector_unified.mask = instruction->raw.mvex.kkk;

    return ZYAN_STATUS_SUCCESS;
}